

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexSeparableKernel::mergeL(PtexSeparableKernel *this,BorderMode mode)

{
  int iVar1;
  float *p;
  long lVar2;
  float fVar3;
  
  iVar1 = this->u;
  lVar2 = -(long)iVar1;
  p = this->ku;
  if (mode != m_black) {
    fVar3 = accumulate(p,(int)lVar2);
    p = this->ku;
    lVar2 = (long)(int)lVar2;
    p[lVar2] = fVar3 + p[lVar2];
  }
  this->ku = p + lVar2;
  this->uw = this->uw + iVar1;
  this->u = 0;
  return;
}

Assistant:

void mergeL(BorderMode mode)
    {
        int w = -u;
        if (mode != m_black)
            ku[w] += accumulate(ku, w);
        ku += w;
        uw -= w;
        u = 0;
    }